

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O0

void Glucose::sort<Glucose::Lit,Glucose::LessThan_default<Glucose::Lit>>
               (LessThan_default<Glucose::Lit> *param_1,int param_2)

{
  undefined4 uVar1;
  bool bVar2;
  int j;
  int i;
  Lit tmp;
  Lit pivot;
  LessThan_default<Glucose::Lit> *this;
  Lit in_stack_ffffffffffffffc0;
  Lit in_stack_ffffffffffffffc4;
  int local_28;
  int local_24;
  
  if (param_2 < 0x10) {
    selectionSort<Glucose::Lit,Glucose::LessThan_default<Glucose::Lit>>(param_1,param_2);
  }
  else {
    local_24 = -1;
    this = param_1;
    local_28 = param_2;
    while( true ) {
      do {
        local_24 = local_24 + 1;
        bVar2 = LessThan_default<Glucose::Lit>::operator()
                          (this,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
      } while (bVar2);
      do {
        local_28 = local_28 + -1;
        bVar2 = LessThan_default<Glucose::Lit>::operator()
                          (this,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
      } while (bVar2);
      if (local_28 <= local_24) break;
      uVar1 = *(undefined4 *)(param_1 + (long)local_24 * 4);
      *(undefined4 *)(param_1 + (long)local_24 * 4) = *(undefined4 *)(param_1 + (long)local_28 * 4);
      *(undefined4 *)(param_1 + (long)local_28 * 4) = uVar1;
    }
    sort<Glucose::Lit,Glucose::LessThan_default<Glucose::Lit>>(param_1,local_24);
    sort<Glucose::Lit,Glucose::LessThan_default<Glucose::Lit>>
              (param_1 + (long)local_24 * 4,param_2 - local_24);
  }
  return;
}

Assistant:

void sort(T* array, int size, LessThan lt)
{
    if (size <= 15)
        selectionSort(array, size, lt);

    else{
        T           pivot = array[size / 2];
        T           tmp;
        int         i = -1;
        int         j = size;

        for(;;){
            do i++; while(lt(array[i], pivot));
            do j--; while(lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i]; array[i] = array[j]; array[j] = tmp;
        }

        sort(array    , i     , lt);
        sort(&array[i], size-i, lt);
    }
}